

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

bool __thiscall miniscript::Node<CPubKey>::IsValid(Node<CPubKey> *this)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  size_t sVar4;
  undefined8 in_RDI;
  Type x;
  long in_FS_OFFSET;
  MiniscriptContext in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Node<CPubKey> *in_stack_ffffffffffffffd0;
  undefined1 local_d;
  
  x.m_flags = (uint32_t)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetType(in_stack_ffffffffffffffd0);
  bVar2 = Type::operator==((Type *)in_stack_ffffffffffffffd0,x);
  if (bVar2) {
    local_d = false;
  }
  else {
    sVar4 = ScriptSize((Node<CPubKey> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    uVar3 = miniscript::internal::MaxScriptSize(in_stack_ffffffffffffffc8);
    local_d = sVar4 <= uVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_d;
  }
  __stack_chk_fail();
}

Assistant:

bool IsValid() const {
        if (GetType() == ""_mst) return false;
        return ScriptSize() <= internal::MaxScriptSize(m_script_ctx);
    }